

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O0

QString * QSqlQueryModelSql::et(QString *a,QString *b)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  bool local_62;
  bool local_61;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isEmpty((QString *)0x15dfc2);
  local_61 = false;
  local_62 = false;
  if (bVar2) {
    QString::QString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    local_62 = QString::isEmpty((QString *)0x15dff0);
    if (local_62) {
      QString::QString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      et();
      latin1.m_data = (char *)in_RSI;
      latin1.m_size = (qsizetype)in_RDX;
      QString::QString(in_RDI,latin1);
      concat(in_RSI,in_RDX);
      concat(in_RSI,in_RDX);
    }
    local_61 = !local_62;
    local_62 = !local_62;
  }
  if (local_62) {
    QString::~QString((QString *)0x15e07b);
  }
  if (local_61) {
    QString::~QString((QString *)0x15e08e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline const static QString et(const QString &a, const QString &b) { return a.isEmpty() ? b : b.isEmpty() ? a : concat(concat(a, et()), b); }